

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect.cc
# Opt level: O2

S2Cap * __thiscall S2LatLngRect::GetCapBound(S2Cap *__return_storage_ptr__,S2LatLngRect *this)

{
  int k;
  int k_00;
  double dVar1;
  double dVar2;
  double dVar3;
  S2Cap pole_cap;
  R2Point local_80;
  S2Cap local_70;
  S2Point local_48;
  
  dVar1 = (this->lat_).bounds_.c_[0];
  dVar2 = (this->lat_).bounds_.c_[1];
  if (dVar1 <= dVar2) {
    dVar3 = dVar1 + dVar2;
    if (0.0 <= dVar3) {
      dVar2 = -dVar1;
    }
    local_48.c_[2] = *(VType *)(&DAT_00272130 + (ulong)(dVar3 < 0.0) * 8);
    local_48.c_[0] = 0.0;
    local_48.c_[1] = 0.0;
    S2Cap::S2Cap(&local_70,&local_48,(S1Angle)(dVar2 + 1.5707963267948966));
    dVar1 = (this->lng_).bounds_.c_[1] - (this->lng_).bounds_.c_[0];
    dVar2 = remainder(dVar1,6.283185307179586);
    if ((0.0 <= dVar2) && (dVar1 < 6.283185307179586)) {
      local_80.c_ = (VType  [2])GetCenter(this);
      S2LatLng::ToPoint(&local_48,(S2LatLng *)&local_80);
      S2Cap::S2Cap(__return_storage_ptr__,&local_48,(S1Angle)0x0);
      for (k_00 = 0; k_00 != 4; k_00 = k_00 + 1) {
        local_80.c_ = (VType  [2])GetVertex(this,k_00);
        S2LatLng::ToPoint(&local_48,(S2LatLng *)&local_80);
        S2Cap::AddPoint(__return_storage_ptr__,&local_48);
      }
      if ((__return_storage_ptr__->radius_).length2_ * 0.5 < local_70.radius_.length2_ * 0.5) {
        return __return_storage_ptr__;
      }
    }
    (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Region_00304750;
    (__return_storage_ptr__->center_).c_[0] = local_70.center_.c_[0];
    (__return_storage_ptr__->center_).c_[1] = local_70.center_.c_[1];
    (__return_storage_ptr__->center_).c_[2] = local_70.center_.c_[2];
    (__return_storage_ptr__->radius_).length2_ = local_70.radius_.length2_;
  }
  else {
    S2Cap::S2Cap(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2LatLngRect::GetCapBound() const {
  // We consider two possible bounding caps, one whose axis passes
  // through the center of the lat-long rectangle and one whose axis
  // is the north or south pole.  We return the smaller of the two caps.

  if (is_empty()) return S2Cap::Empty();

  double pole_z, pole_angle;
  if (lat_.lo() + lat_.hi() < 0) {
    // South pole axis yields smaller cap.
    pole_z = -1;
    pole_angle = M_PI_2 + lat_.hi();
  } else {
    pole_z = 1;
    pole_angle = M_PI_2 - lat_.lo();
  }
  S2Cap pole_cap(S2Point(0, 0, pole_z), S1Angle::Radians(pole_angle));

  // For bounding rectangles that span 180 degrees or less in longitude, the
  // maximum cap size is achieved at one of the rectangle vertices.  For
  // rectangles that are larger than 180 degrees, we punt and always return a
  // bounding cap centered at one of the two poles.
  double lng_span = lng_.hi() - lng_.lo();
  if (remainder(lng_span, 2 * M_PI) >= 0 && lng_span < 2 * M_PI) {
    S2Cap mid_cap(GetCenter().ToPoint(), S1Angle::Radians(0));
    for (int k = 0; k < 4; ++k) {
      mid_cap.AddPoint(GetVertex(k).ToPoint());
    }
    if (mid_cap.height() < pole_cap.height())
      return mid_cap;
  }
  return pole_cap;
}